

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

OPENSSL_STACK * OPENSSL_sk_new(OPENSSL_sk_cmp_func comp)

{
  void *pvVar1;
  OPENSSL_STACK *ret;
  OPENSSL_sk_cmp_func comp_local;
  
  comp_local = (OPENSSL_sk_cmp_func)OPENSSL_zalloc(0x28);
  if (comp_local == (OPENSSL_sk_cmp_func)0x0) {
    comp_local = (OPENSSL_sk_cmp_func)0x0;
  }
  else {
    pvVar1 = OPENSSL_calloc(4,8);
    *(void **)(comp_local + 8) = pvVar1;
    if (*(long *)(comp_local + 8) == 0) {
      OPENSSL_free(comp_local);
      comp_local = (OPENSSL_sk_cmp_func)0x0;
    }
    else {
      *(OPENSSL_sk_cmp_func *)(comp_local + 0x20) = comp;
      *(undefined8 *)(comp_local + 0x18) = 4;
    }
  }
  return (OPENSSL_STACK *)comp_local;
}

Assistant:

OPENSSL_STACK *OPENSSL_sk_new(OPENSSL_sk_cmp_func comp) {
  OPENSSL_STACK *ret =
      reinterpret_cast<OPENSSL_STACK *>(OPENSSL_zalloc(sizeof(OPENSSL_STACK)));
  if (ret == NULL) {
    return NULL;
  }

  ret->data =
      reinterpret_cast<void **>(OPENSSL_calloc(kMinSize, sizeof(void *)));
  if (ret->data == NULL) {
    goto err;
  }

  ret->comp = comp;
  ret->num_alloc = kMinSize;

  return ret;

err:
  OPENSSL_free(ret);
  return NULL;
}